

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

value_type * __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
::FindAndConstruct(DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                   *this,KeyID *Key)

{
  bool bVar1;
  DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
  *local_28;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *TheBucket;
  KeyID *Key_local;
  DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
  *this_local;
  
  TheBucket = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)Key;
  Key_local = (KeyID *)this;
  bVar1 = LookupBucketFor<llbuild::core::KeyID>
                    (this,Key,(DenseMapPair<llbuild::core::KeyID,_DBKeyID> **)&local_28);
  if (bVar1) {
    this_local = local_28;
  }
  else {
    this_local = (DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                  *)DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,DBKeyID,llvm::DenseMapInfo<llbuild::core::KeyID>,llvm::detail::DenseMapPair<llbuild::core::KeyID,DBKeyID>>,llbuild::core::KeyID,DBKeyID,llvm::DenseMapInfo<llbuild::core::KeyID>,llvm::detail::DenseMapPair<llbuild::core::KeyID,DBKeyID>>
                    ::InsertIntoBucket<llbuild::core::KeyID_const&>
                              ((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,DBKeyID,llvm::DenseMapInfo<llbuild::core::KeyID>,llvm::detail::DenseMapPair<llbuild::core::KeyID,DBKeyID>>,llbuild::core::KeyID,DBKeyID,llvm::DenseMapInfo<llbuild::core::KeyID>,llvm::detail::DenseMapPair<llbuild::core::KeyID,DBKeyID>>
                                *)this,(DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)local_28,
                               (KeyID *)TheBucket);
  }
  return (value_type *)this_local;
}

Assistant:

value_type& FindAndConstruct(const KeyT &Key) {
    BucketT *TheBucket;
    if (LookupBucketFor(Key, TheBucket))
      return *TheBucket;

    return *InsertIntoBucket(TheBucket, Key);
  }